

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O2

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkTimeGrant(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  int32_t *piVar1;
  IterationRequest IVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  Time desiredGrantTime;
  long lVar8;
  GrantDelayMode delayMode;
  bool bVar9;
  byte bVar10;
  uint8_t uVar11;
  byte bVar12;
  byte bVar13;
  pointer pDVar14;
  char cVar15;
  
  (*(this->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])();
  lVar7 = (this->time_allow).internalTimeCode;
  desiredGrantTime.internalTimeCode = (this->time_exec).internalTimeCode;
  if (lVar7 == 0x7fffffffffffffff && desiredGrantTime.internalTimeCode == 0x7fffffffffffffff) {
    (this->time_granted).internalTimeCode = 0x7fffffffffffffff;
    (this->time_grantBase).internalTimeCode = 0x7fffffffffffffff;
    BaseTimeCoordinator::disconnect(&this->super_BaseTimeCoordinator);
    return HALTED;
  }
  lVar8 = (this->time_block).internalTimeCode;
  if ((lVar8 == 0x7fffffffffffffff || desiredGrantTime.internalTimeCode < lVar8) &&
     (lVar8 = (this->time_requested).internalTimeCode,
     (desiredGrantTime.internalTimeCode < lVar8 & (this->super_BaseTimeCoordinator).nonGranting) !=
     1)) {
    IVar2 = this->iterating;
    cVar15 = this->needSendAll;
    this->needSendAll = false;
    if (IVar2 - 1 < 2) {
      if (desiredGrantTime.internalTimeCode < lVar7) {
        if (((this->time_granted).internalTimeCode < desiredGrantTime.internalTimeCode) &&
           (this->hasIterationData != true)) {
          if (IVar2 == FORCE_ITERATION) {
            LOCK();
            (this->iteration).super___atomic_base<int>._M_i =
                 (this->iteration).super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          else {
            LOCK();
            (this->iteration).super___atomic_base<int>._M_i = 0;
            UNLOCK();
            (this->super_BaseTimeCoordinator).sequenceCounter = 0;
          }
          updateTimeGrant(this);
          return (this->iterating == FORCE_ITERATION) * '\x02';
        }
LAB_002d22de:
        LOCK();
        (this->iteration).super___atomic_base<int>._M_i =
             (this->iteration).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this->hasIterationData = false;
        goto LAB_002d22ec;
      }
      if (lVar7 == desiredGrantTime.internalTimeCode) {
        if (desiredGrantTime.internalTimeCode == lVar8) {
          if ((this->info).wait_for_current_time_updates == false) goto LAB_002d2348;
        }
        else {
          bVar9 = TimeDependencies::checkIfReadyForTimeGrant
                            (&(this->super_BaseTimeCoordinator).dependencies,true,desiredGrantTime,
                             (this->info).wait_for_current_time_updates * '\x02');
          if (bVar9) {
            if (this->hasIterationData != false) goto LAB_002d22de;
            lVar7 = (this->time_exec).internalTimeCode;
            if ((this->time_granted).internalTimeCode < lVar7) {
LAB_002d2348:
              if (this->iterating != FORCE_ITERATION) {
LAB_002d230c:
                LOCK();
                (this->iteration).super___atomic_base<int>._M_i = 0;
                UNLOCK();
                (this->super_BaseTimeCoordinator).sequenceCounter = 0;
                this->hasIterationData = false;
                updateTimeGrant(this);
                return NEXT_STEP;
              }
              LOCK();
              (this->iteration).super___atomic_base<int>._M_i =
                   (this->iteration).super___atomic_base<int>._M_i + 1;
              UNLOCK();
              this->hasIterationData = false;
              (this->time_exec).internalTimeCode = (this->time_granted).internalTimeCode;
LAB_002d22ec:
              updateTimeGrant(this);
              return ITERATING;
            }
            bVar9 = (this->info).wait_for_current_time_updates;
            bVar3 = (this->info).restrictive_time_policy;
            bVar12 = bVar9 ^ 1;
            bVar13 = bVar3;
            if (bVar9 == false) {
              iVar5 = (this->super_BaseTimeCoordinator).sequenceCounter;
              bVar10 = 0x32;
              for (pDVar14 = (this->super_BaseTimeCoordinator).dependencies.dependencies.
                             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pDVar14 !=
                  (this->super_BaseTimeCoordinator).dependencies.dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pDVar14 = pDVar14 + 1) {
                if (((pDVar14->dependency == true) &&
                    ((pDVar14->super_TimeData).next.internalTimeCode <= lVar7)) &&
                   (pDVar14->connection != SELF)) {
                  iVar6 = (pDVar14->super_TimeData).responseSequenceCounter;
                  if ((pDVar14->super_TimeData).minFed.gid !=
                      (this->super_BaseTimeCoordinator).mSourceId.gid) {
                    bVar12 = 0;
                  }
                  if ((iVar6 == iVar5 & bVar3) == 1) {
                    bVar4 = (pDVar14->super_TimeData).restrictionLevel;
                    if (bVar4 <= bVar10) {
                      bVar10 = bVar4;
                    }
                  }
                  else if (iVar6 != iVar5) {
                    bVar12 = 0;
                    bVar13 = 0;
                    break;
                  }
                }
              }
            }
            else {
              bVar10 = 0x32;
            }
            if ((bVar12 & 1) == 0) {
              if (bVar13 != 0) {
                uVar11 = bVar10 + 1;
LAB_002d24ec:
                this->currentRestrictionLevel = uVar11;
                piVar1 = &(this->super_BaseTimeCoordinator).sequenceCounter;
                *piVar1 = *piVar1 + 1;
                cVar15 = '\x01';
              }
            }
            else {
              if ((bVar3 == false) || (bVar10 != 0)) goto LAB_002d2348;
              uVar11 = '\x01';
              if (this->currentRestrictionLevel != '\x01') goto LAB_002d24ec;
            }
          }
        }
      }
    }
    else if (IVar2 == NO_ITERATIONS) {
      if (desiredGrantTime.internalTimeCode < lVar7) goto LAB_002d230c;
      if (lVar7 == desiredGrantTime.internalTimeCode) {
        bVar9 = (this->info).wait_for_current_time_updates;
        if (lVar8 <= desiredGrantTime.internalTimeCode && bVar9 == false) goto LAB_002d230c;
        delayMode = WAITING;
        if (bVar9 == false) {
          delayMode = desiredGrantTime.internalTimeCode < lVar8;
        }
        bVar9 = TimeDependencies::checkIfReadyForTimeGrant
                          (&(this->super_BaseTimeCoordinator).dependencies,false,desiredGrantTime,
                           delayMode);
        if (bVar9) goto LAB_002d230c;
      }
    }
    if ((triggerFed.gid == -1700000000) || (triggerFed.gid == -2010000000)) {
      if (cVar15 == '\0') {
        return CONTINUE_PROCESSING;
      }
    }
    else if (cVar15 == '\0') goto LAB_002d228f;
    sendTimeRequest(this,(GlobalFederateId)0x8831d580);
  }
  else {
    if (triggerFed.gid == -2010000000) {
      return CONTINUE_PROCESSING;
    }
    if (triggerFed.gid == -1700000000) {
      return CONTINUE_PROCESSING;
    }
LAB_002d228f:
    if ((this->super_BaseTimeCoordinator).mSourceId.gid != triggerFed.gid) {
      sendTimeRequest(this,triggerFed);
    }
  }
  return CONTINUE_PROCESSING;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkTimeGrant(GlobalFederateId triggerFed)
{
    updateTimeFactors();
    if (time_exec == Time::maxVal()) {
        if (time_allow == Time::maxVal()) {
            time_granted = Time::maxVal();
            time_grantBase = Time::maxVal();
            disconnect();
            return MessageProcessingResult::HALTED;
        }
    }
    if (time_block <= time_exec && time_block < Time::maxVal()) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    if ((nonGranting && time_exec < time_requested)) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    // if ((iterating == IterationRequest::NO_ITERATIONS) ||
    //     (time_exec > time_granted && iterating == IterationRequest::ITERATE_IF_NEEDED)) {
    //
    //     if (time_allow > time_exec) {
    //         iteration = 0;
    //         updateTimeGrant();
    //         return MessageProcessingResult::NEXT_STEP;
    //     }
    //     if (time_allow == time_exec) {
    //         if (!info.wait_for_current_time_updates) {
    //             if (time_requested <= time_exec) {
    //                 // this is the non interrupted case
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //             if (dependencies.checkIfReadyForTimeGrant(false, time_exec)) {
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //         } else {
    //             // if the wait_for_current_time_updates flag is set then time_allow must be
    //             greater
    //             // than time_exec
    //         }
    //     }
    // } else {
    //     if (time_allow > time_exec) {
    //         ++iteration;
    //         updateTimeGrant();
    //         return MessageProcessingResult::ITERATING;
    //     }
    //     if (time_allow == time_exec)  // time_allow==time_exec==time_granted
    //     {
    //         if (dependencies.checkIfReadyForTimeGrant(true, time_exec)) {
    //             ++iteration;
    //             updateTimeGrant();
    //             return MessageProcessingResult::ITERATING;
    //         }
    //     }
    // }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (time_allow > time_exec) {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
                return MessageProcessingResult::NEXT_STEP;
            }
            if (time_allow == time_exec) {
                if (!info.wait_for_current_time_updates) {
                    if (time_requested <= time_exec) {
                        // this is the non interrupted case
                        iteration = 0;
                        sequenceCounter = 0;
                        hasIterationData = false;
                        updateTimeGrant();
                        return MessageProcessingResult::NEXT_STEP;
                    }
                }

                auto delayMode =
                    getDelayMode(info.wait_for_current_time_updates, (time_requested > time_exec));
                if (dependencies.checkIfReadyForTimeGrant(false, time_exec, delayMode)) {
                    iteration = 0;
                    sequenceCounter = 0;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::NEXT_STEP;
                }

                // if the wait_for_current_time_updates flag is set then time_allow must be greater
                // than time_exec
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (time_allow > time_exec) {
                if (time_exec <= time_granted || hasIterationData) {
                    ++iteration;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::ITERATING;
                }
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ++iteration;
                } else {
                    iteration = 0;
                    sequenceCounter = 0;
                }

                updateTimeGrant();
                return (iterating == IterationRequest::FORCE_ITERATION) ?
                    MessageProcessingResult::ITERATING :
                    MessageProcessingResult::NEXT_STEP;
            }

            if (time_allow == time_exec) {
                if (time_allow == time_requested) {
                    if (!info.wait_for_current_time_updates) {
                        if (time_requested <= time_exec) {
                            // this is the non interrupted case
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                        if (dependencies.checkIfReadyForTimeGrant(false,
                                                                  time_exec,
                                                                  GrantDelayMode::NONE)) {
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                    }
                    ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    break;
                }
                if (dependencies.checkIfReadyForTimeGrant(
                        true, time_exec, getDelayMode(info.wait_for_current_time_updates, false))) {
                    if (hasIterationData) {
                        ret = MessageProcessingResult::ITERATING;
                        break;
                    }
                    if (time_exec > time_granted) {
                        ret = MessageProcessingResult::NEXT_STEP;
                        break;
                    }
                    // time_
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.next > time_exec || dep.connection == ConnectionType::SELF) {
                                continue;
                            }

                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }

            break;
        default:
            break;
    }

    switch (ret) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            if (triggerFed.isValid() || sendAll) {
                if (sendAll) {
                    sendTimeRequest(GlobalFederateId{});
                } else {
                    if (triggerFed != mSourceId) {
                        sendTimeRequest(triggerFed);
                    }
                }
            }
            break;
        case MessageProcessingResult::ITERATING:
            ++iteration;
            hasIterationData = false;
            updateTimeGrant();
            break;
        case MessageProcessingResult::NEXT_STEP:
            if (iterating == IterationRequest::FORCE_ITERATION) {
                ++iteration;
                hasIterationData = false;
                time_exec = time_granted;
                updateTimeGrant();
                ret = MessageProcessingResult::ITERATING;
            } else {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
            }
            break;
        default:
            break;
    }

    return ret;
}